

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredImage::LayeredImage
          (LayeredImage *this,TextureType type,TextureFormat *format,int w,int h,int d)

{
  Texture1D *ptr;
  Texture2D *ptr_00;
  TextureCube *ptr_01;
  Texture3D *ptr_02;
  Texture2DArray *ptr_03;
  int d_local;
  int h_local;
  int w_local;
  TextureFormat *format_local;
  TextureType type_local;
  LayeredImage *this_local;
  
  this->m_type = type;
  tcu::Vector<int,_3>::Vector(&this->m_size,w,h,d);
  this->m_format = *format;
  if (type == TEXTURETYPE_BUFFER) {
    ptr = newOneLevelTexture1D(format,w);
    de::SharedPtr<tcu::Texture1D>::SharedPtr(&this->m_texBuffer,ptr);
  }
  else {
    de::SharedPtr<tcu::Texture1D>::SharedPtr(&this->m_texBuffer);
  }
  if (type == TEXTURETYPE_2D) {
    ptr_00 = newOneLevelTexture2D(format,w,h);
    de::SharedPtr<tcu::Texture2D>::SharedPtr(&this->m_tex2D,ptr_00);
  }
  else {
    de::SharedPtr<tcu::Texture2D>::SharedPtr(&this->m_tex2D);
  }
  if (type == TEXTURETYPE_CUBE) {
    ptr_01 = newOneLevelTextureCube(format,w);
    de::SharedPtr<tcu::TextureCube>::SharedPtr(&this->m_texCube,ptr_01);
  }
  else {
    de::SharedPtr<tcu::TextureCube>::SharedPtr(&this->m_texCube);
  }
  if (type == TEXTURETYPE_3D) {
    ptr_02 = newOneLevelTexture3D(format,w,h,d);
    de::SharedPtr<tcu::Texture3D>::SharedPtr(&this->m_tex3D,ptr_02);
  }
  else {
    de::SharedPtr<tcu::Texture3D>::SharedPtr(&this->m_tex3D);
  }
  if (type == TEXTURETYPE_2D_ARRAY) {
    ptr_03 = newOneLevelTexture2DArray(format,w,h,d);
    de::SharedPtr<tcu::Texture2DArray>::SharedPtr(&this->m_tex2DArray,ptr_03);
  }
  else {
    de::SharedPtr<tcu::Texture2DArray>::SharedPtr(&this->m_tex2DArray);
  }
  return;
}

Assistant:

LayeredImage::LayeredImage (TextureType type, const TextureFormat& format, int w, int h, int d)
	: m_type		(type)
	, m_size		(w, h, d)
	, m_format		(format)
	, m_texBuffer	(type == TEXTURETYPE_BUFFER		? SharedPtr<tcu::Texture1D>			(newOneLevelTexture1D		(format, w))		: SharedPtr<tcu::Texture1D>())
	, m_tex2D		(type == TEXTURETYPE_2D			? SharedPtr<tcu::Texture2D>			(newOneLevelTexture2D		(format, w, h))		: SharedPtr<tcu::Texture2D>())
	, m_texCube		(type == TEXTURETYPE_CUBE		? SharedPtr<tcu::TextureCube>		(newOneLevelTextureCube		(format, w))		: SharedPtr<tcu::TextureCube>())
	, m_tex3D		(type == TEXTURETYPE_3D			? SharedPtr<tcu::Texture3D>			(newOneLevelTexture3D		(format, w, h, d))	: SharedPtr<tcu::Texture3D>())
	, m_tex2DArray	(type == TEXTURETYPE_2D_ARRAY	? SharedPtr<tcu::Texture2DArray>	(newOneLevelTexture2DArray	(format, w, h, d))	: SharedPtr<tcu::Texture2DArray>())
{
	DE_ASSERT(m_size.z() == 1					||
			  m_type == TEXTURETYPE_3D			||
			  m_type == TEXTURETYPE_2D_ARRAY);

	DE_ASSERT(m_size.y() == 1					||
			  m_type == TEXTURETYPE_2D			||
			  m_type == TEXTURETYPE_CUBE		||
			  m_type == TEXTURETYPE_3D			||
			  m_type == TEXTURETYPE_2D_ARRAY);

	DE_ASSERT(w == h || type != TEXTURETYPE_CUBE);

	DE_ASSERT(m_texBuffer	!= DE_NULL ||
			  m_tex2D		!= DE_NULL ||
			  m_texCube		!= DE_NULL ||
			  m_tex3D		!= DE_NULL ||
			  m_tex2DArray	!= DE_NULL);
}